

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

bool __thiscall
cs_impl::any::holder<cs::type_id>::compare(holder<cs::type_id> *this,baseHolder *obj)

{
  char *__s1;
  char *__s2;
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar4;
  
  iVar2 = (*obj->_vptr_baseHolder[2])(obj);
  iVar3 = (*(this->super_baseHolder)._vptr_baseHolder[2])(this);
  __s1 = *(char **)(CONCAT44(extraout_var,iVar2) + 8);
  __s2 = *(char **)(CONCAT44(extraout_var_00,iVar3) + 8);
  if (__s1 == __s2) {
LAB_002638dd:
    if ((holder<cs::type_id> *)obj == this) {
      bVar4 = true;
    }
    else {
      pp_Var1 = (_func_int **)(this->mDat).type_hash;
      if (pp_Var1 == (_func_int **)0x0) {
        bVar4 = std::type_index::operator==(&(this->mDat).type_idx,(type_index *)(obj + 1));
        return bVar4;
      }
      bVar4 = pp_Var1 == obj[2]._vptr_baseHolder;
    }
  }
  else {
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) goto LAB_002638dd;
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool compare(const baseHolder *obj) const override
			{
				if (obj->type() == this->type())
					return cs_impl::compare(mDat, static_cast<const holder<T> *>(obj)->data());
				else
					return false;
			}